

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

size_t __thiscall prometheus::detail::LabelHasher::operator()(LabelHasher *this,Labels *labels)

{
  _Base_ptr p_Var1;
  size_t seed;
  size_t local_20;
  
  local_20 = 0;
  for (p_Var1 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(labels->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    hash_combine<std::__cxx11::string,std::__cxx11::string>
              (&local_20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 2));
  }
  return local_20;
}

Assistant:

std::size_t LabelHasher::operator()(const Labels& labels) const {
  std::size_t seed = 0;
  for (auto& label : labels) {
    hash_combine(&seed, label.first, label.second);
  }

  return seed;
}